

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GetConfigAttribTransparentValueCase::executeTest
          (GetConfigAttribTransparentValueCase *this,EGLConfig config)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  EGLint EVar2;
  EGLint EVar3;
  EGLint EVar4;
  EGLint EVar5;
  EGLint EVar6;
  EGLint EVar7;
  EGLint EVar8;
  undefined1 local_1b0 [384];
  
  pTVar1 = ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
           )->m_log;
  EVar2 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3034,true);
  EVar3 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3037,true);
  EVar4 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3036,true);
  EVar5 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3035,true);
  EVar6 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3024,true);
  EVar7 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3023,true);
  EVar8 = GetConfigAttribCase::getValue(&this->super_GetConfigAttribCase,config,0x3022,true);
  if (EVar2 == 0x3052) {
    if (((-1 < EVar3) && (-1 < EVar4)) && (EVar3 < 1 << ((byte)EVar6 & 0x1f))) {
      if (((-1 < EVar5) && (EVar4 < 1 << ((byte)EVar7 & 0x1f))) &&
         (EVar5 < 1 << ((byte)EVar8 & 0x1f))) {
        return;
      }
    }
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar1;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "Fail, transparent color values must lie between 0 and the maximum component value."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    tcu::TestContext::setTestResult
              ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Invalid transparent color value");
  }
  return;
}

Assistant:

void executeTest (EGLConfig config)
	{
		TestLog&		log	= m_testCtx.getLog();

		const EGLint	transparentType	= getValue(config, EGL_TRANSPARENT_TYPE);
		const EGLint	redValue		= getValue(config, EGL_TRANSPARENT_RED_VALUE);
		const EGLint	greenValue		= getValue(config, EGL_TRANSPARENT_GREEN_VALUE);
		const EGLint	blueValue		= getValue(config, EGL_TRANSPARENT_BLUE_VALUE);

		const EGLint	redSize			= getValue(config, EGL_RED_SIZE);
		const EGLint	greenSize		= getValue(config, EGL_GREEN_SIZE);
		const EGLint	blueSize		= getValue(config, EGL_BLUE_SIZE);

		if (transparentType == EGL_TRANSPARENT_RGB)
		{
			if (   (redValue	< 0	|| redValue		>= (1 << redSize))
				|| (greenValue	< 0	|| greenValue	>= (1 << greenSize))
				|| (blueValue	< 0	|| blueValue	>= (1 << blueSize))	)
			{
				log << TestLog::Message << "Fail, transparent color values must lie between 0 and the maximum component value." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid transparent color value");
			}
		}
	}